

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O1

vector<LinkedToken,_std::allocator<LinkedToken>_> * __thiscall
ResponseBase::extractLinksFromLine
          (vector<LinkedToken,_std::allocator<LinkedToken>_> *__return_storage_ptr__,
          ResponseBase *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  size_type __pos;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  string text;
  string link;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenEnd;
  string local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  undefined8 local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Token local_c8;
  string local_a0;
  LinkedToken local_80;
  char *local_38;
  
  (__return_storage_ptr__->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = __return_storage_ptr__;
  uVar7 = std::__cxx11::string::find((char)line,0x5b);
  if (uVar7 != 0xffffffffffffffff) {
    do {
      uVar3 = line->_M_string_length;
      uVar9 = 0xffffffffffffffff;
      if (uVar7 + 1 < uVar3) {
        iVar11 = 1;
        uVar9 = uVar7;
        do {
          cVar2 = (line->_M_dataplus)._M_p[uVar9 + 1];
          iVar11 = (iVar11 + (uint)(cVar2 == '[')) - (uint)(cVar2 == ']');
          uVar10 = uVar9 + 2;
          uVar9 = uVar9 + 1;
          if (uVar3 <= uVar10) break;
        } while (0 < iVar11);
        if (0 < iVar11) {
          uVar9 = 0xffffffffffffffff;
        }
      }
      if (((uVar9 != 0xffffffffffffffff) && (uVar9 + 2 < uVar3)) &&
         (pcVar4 = (line->_M_dataplus)._M_p, pcVar4[uVar9 + 1] == '(')) {
        uVar10 = 0xffffffffffffffff;
        if (uVar9 + 2 < uVar3) {
          iVar11 = 1;
          uVar5 = uVar9 + 3;
          do {
            uVar10 = uVar5;
            cVar2 = pcVar4[uVar10 - 1];
            iVar11 = (iVar11 + (uint)(cVar2 == '(')) - (uint)(cVar2 == ')');
            if (uVar3 <= uVar10) break;
            uVar5 = uVar10 + 1;
          } while (0 < iVar11);
          uVar10 = uVar10 - 1;
          if (0 < iVar11) {
            uVar10 = 0xffffffffffffffff;
          }
        }
        if (((uVar10 != 0xffffffffffffffff) && (uVar7 < uVar9)) && (uVar9 + 1 < uVar10)) {
          std::__cxx11::string::substr((ulong)&local_130,(ulong)line);
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<ResponseBase::extractLinksFromLine(std::__cxx11::string_const&)const::_lambda(char)_1_>>
                            ();
          if ((_Var8._M_current != local_130._M_dataplus._M_p) &&
             (_Var8._M_current != local_130._M_dataplus._M_p + local_130._M_string_length)) {
            std::__cxx11::string::_M_erase((ulong)&local_130,0);
          }
          local_80.token.content._M_dataplus._M_p =
               local_130._M_dataplus._M_p + local_130._M_string_length;
          local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_130._M_dataplus._M_p;
          std::
          __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<ResponseBase::extractLinksFromLine(std::__cxx11::string_const&)const::_lambda(char)_2_>>
                    (&local_38,&local_80,&local_e8);
          if ((long)local_38 - (long)local_130._M_dataplus._M_p != 0 &&
              local_38 != local_130._M_dataplus._M_p + local_130._M_string_length) {
            *local_38 = '\0';
            local_130._M_string_length = (long)local_38 - (long)local_130._M_dataplus._M_p;
          }
          bVar6 = Token::isToken(&local_130);
          if (bVar6) {
            std::__cxx11::string::substr((ulong)&local_e8,(ulong)line);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p == &local_130.field_2) {
              local_a0.field_2._8_8_ = local_130.field_2._8_8_;
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            }
            else {
              local_a0._M_dataplus._M_p = local_130._M_dataplus._M_p;
            }
            local_a0.field_2._M_allocated_capacity._1_7_ =
                 local_130.field_2._M_allocated_capacity._1_7_;
            local_a0.field_2._M_local_buf[0] = local_130.field_2._M_local_buf[0];
            local_a0._M_string_length = local_130._M_string_length;
            local_130._M_string_length = 0;
            local_130.field_2._M_local_buf[0] = '\0';
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            Token::Token(&local_c8,&local_a0);
            local_80.link._M_string_length = local_e0;
            local_110 = &local_100;
            paVar1 = &local_c8.content.field_2;
            if (local_e8 == &local_d8) {
              local_100._8_8_ = local_d8._8_8_;
            }
            else {
              local_110 = local_e8;
            }
            local_100._M_allocated_capacity._1_7_ = local_d8._M_allocated_capacity._1_7_;
            local_100._M_local_buf[0] = local_d8._M_local_buf[0];
            local_e0 = 0;
            local_d8._M_local_buf[0] = '\0';
            local_80.token.content._M_dataplus._M_p = (pointer)&local_80.token.content.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.content._M_dataplus._M_p == paVar1) {
              local_80.token.content.field_2._8_8_ = local_c8.content.field_2._8_8_;
            }
            else {
              local_80.token.content._M_dataplus._M_p = local_c8.content._M_dataplus._M_p;
            }
            local_80.token.content.field_2._M_allocated_capacity._1_7_ =
                 local_c8.content.field_2._M_allocated_capacity._1_7_;
            local_80.token.content.field_2._M_local_buf[0] =
                 local_c8.content.field_2._M_local_buf[0];
            local_80.token.content._M_string_length = local_c8.content._M_string_length;
            local_c8.content._M_string_length = 0;
            local_c8.content.field_2._M_local_buf[0] = '\0';
            local_80.token.type = local_c8.type;
            local_80.link._M_dataplus._M_p = (pointer)&local_80.link.field_2;
            if (local_110 == &local_100) {
              local_80.link.field_2._8_8_ = local_100._8_8_;
            }
            else {
              local_80.link._M_dataplus._M_p = (pointer)local_110;
            }
            local_80.link.field_2._M_allocated_capacity = local_100._M_allocated_capacity;
            local_108 = 0;
            local_100._M_allocated_capacity =
                 (ulong)(uint7)local_d8._M_allocated_capacity._1_7_ << 8;
            local_110 = &local_100;
            local_e8 = &local_d8;
            local_c8.content._M_dataplus._M_p = (pointer)paVar1;
            std::vector<LinkedToken,_std::allocator<LinkedToken>_>::emplace_back<LinkedToken>
                      (local_f0,&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80.link._M_dataplus._M_p != &local_80.link.field_2) {
              operator_delete(local_80.link._M_dataplus._M_p,
                              local_80.link.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80.token.content._M_dataplus._M_p != &local_80.token.content.field_2) {
              operator_delete(local_80.token.content._M_dataplus._M_p,
                              local_80.token.content.field_2._M_allocated_capacity + 1);
            }
            if (local_110 != &local_100) {
              operator_delete(local_110,local_100._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.content._M_dataplus._M_p != &local_c8.content.field_2) {
              operator_delete(local_c8.content._M_dataplus._M_p,
                              CONCAT71(local_c8.content.field_2._M_allocated_capacity._1_7_,
                                       local_c8.content.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            if (local_e8 != &local_d8) {
              operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,
                                                local_d8._M_local_buf[0]) + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,
                            CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                     local_130.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      uVar7 = std::__cxx11::string::find((char)line,0x5b);
    } while (uVar7 != 0xffffffffffffffff);
  }
  return local_f0;
}

Assistant:

std::vector<LinkedToken> extractLinksFromLine(const std::string& line) const { // TODO needs some love
        std::vector<LinkedToken> links;

        for (size_t textBegin = line.find('['); textBegin != std::string::npos; textBegin = line.find('[', textBegin + 1)) {
            const size_t textEnd = braceEnd(line, textBegin, '[', ']');
            if (textEnd == std::string::npos) {
                continue;
            }

            size_t linkBegin = textEnd + 1;
            if ((line.length() > textEnd + 2) and (line[linkBegin] == '(')) {
                const size_t linkEnd = braceEnd(line, linkBegin, '(', ')');
                if (linkEnd == -1) {
                    continue;
                }

                textBegin++;
                linkBegin++;

                if ((textBegin > textEnd) or (linkBegin > linkEnd) or (textEnd > linkBegin)) {
                    continue;
                }

                std::string text = line.substr(textBegin, textEnd - textBegin);
                const auto tokenBegin = std::find_if(text.begin(), text.end(), [](char c) {
                    return canBePartOfIdentifier(c);
                });
                if ((tokenBegin != text.begin()) and (tokenBegin != text.end())) {
                    text.erase(text.begin(), tokenBegin);
                }

                const auto tokenEnd = std::find_if(text.rbegin(), text.rend(), [](char c) {
                    return canBePartOfIdentifier(c);
                });
                if ((tokenEnd != text.rbegin()) and (tokenEnd != text.rend())) {
                    text.erase(tokenEnd.base(), text.end());
                }

                if (Token::isToken(text)) {
                    std::string link = line.substr(linkBegin, linkEnd - linkBegin);
                    links.push_back(LinkedToken(Token(std::move(text)), std::move(link)));
                }
            }
        }

        return links;
    }